

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  bool bVar1;
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
  *pFVar2;
  SourceLocation local_220;
  __pid_t local_204;
  int local_200;
  bool local_1fa;
  undefined1 auStack_1f8 [6];
  bool _kj_shouldLog_1;
  __pid_t local_1dc;
  int local_1d8;
  DebugExpression<int> local_1d4;
  undefined1 local_1d0 [8];
  DebugComparison<int,_int> _kjCondition_1;
  SourceLocation local_1a8;
  __pid_t local_18c;
  int local_188;
  bool local_182;
  undefined1 auStack_180 [6];
  bool _kj_shouldLog;
  __pid_t local_164;
  int local_160;
  DebugExpression<int> local_15c;
  undefined1 local_158 [8];
  DebugComparison<int,_int> _kjCondition;
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
  releaseFork;
  undefined1 local_120 [8];
  Promise<int> local_118;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:597:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch2;
  undefined1 local_108 [8];
  Promise<int> local_100;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:593:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch1;
  SourceLocation local_f0;
  undefined1 local_d8 [8];
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> fork
  ;
  undefined1 local_c0 [8];
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> promise;
  WaitScope waitScope;
  EventLoop loop;
  TestCase583 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope
            ((WaitScope *)&stack0xffffffffffffff58,(EventLoop *)&waitScope.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase583::run()::__0>
            ((kj *)local_c0,(Type *)((long)&fork.hub.ptr + 7));
  SourceLocation::SourceLocation
            (&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x24f,0xf);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::fork
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
              *)local_d8);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)local_108);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>::
  then<kj::(anonymous_namespace)::TestCase583::run()::__1>
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>
              *)&local_100,(Type *)local_108);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::~Promise
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
              *)local_108);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)local_120);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>::
  then<kj::(anonymous_namespace)::TestCase583::run()::__2>
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>
              *)&local_118,(Type *)local_120);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::~Promise
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
              *)local_120);
  pFVar2 = mv<kj::ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>>
                     ((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
                       *)local_d8);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  ForkedPromise((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
                 *)&_kjCondition.result,pFVar2);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  ~ForkedPromise((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
                  *)&_kjCondition.result);
  local_160 = 0x1c8;
  local_15c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_160);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_180,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x25e,0x29);
  local_164 = Promise<int>::wait(&local_100,&stack0xffffffffffffff58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_158,&local_15c,&local_164);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_158);
  if (!bVar1) {
    local_182 = kj::_::Debug::shouldLog(ERROR);
    while (local_182 != false) {
      local_188 = 0x1c8;
      SourceLocation::SourceLocation
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x25e,0x29);
      local_18c = Promise<int>::wait(&local_100,&stack0xffffffffffffff58);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x25e,ERROR,
                 "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_158,&local_188,&local_18c);
      local_182 = false;
    }
  }
  local_1d8 = 0x315;
  local_1d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d8);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x25f,0x29);
  local_1dc = Promise<int>::wait(&local_118,&stack0xffffffffffffff58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1d0,&local_1d4,&local_1dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    local_1fa = kj::_::Debug::shouldLog(ERROR);
    while (local_1fa != false) {
      local_200 = 0x315;
      SourceLocation::SourceLocation
                (&local_220,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x25f,0x29);
      local_204 = Promise<int>::wait(&local_118,&stack0xffffffffffffff58);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x25f,ERROR,
                 "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_1d0,&local_200,&local_204);
      local_1fa = false;
    }
  }
  Promise<int>::~Promise(&local_118);
  Promise<int>::~Promise(&local_100);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  ~ForkedPromise((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
                  *)local_d8);
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::~Promise
            ((Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
              *)local_c0);
  WaitScope::~WaitScope((WaitScope *)&stack0xffffffffffffff58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, ForkMaybeRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Maybe<Own<RefcountedInt>>> promise = evalLater([&]() {
    return Maybe<Own<RefcountedInt>>(refcounted<RefcountedInt>(123));
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}